

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O3

void __thiscall
slang::analysis::
AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>::setState
          (AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
           *this,DataFlowState *newState)

{
  char *__s;
  SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> local_b0;
  bool local_18;
  
  this->isStateSplit = false;
  SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::operator=
            ((SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)&this->state
             ,(SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)newState);
  (this->state).reachable = newState->reachable;
  __s = local_b0.firstElement;
  memset(__s,0,0x88);
  local_b0.len = 0;
  local_b0.cap = 2;
  local_18 = true;
  local_b0.data_ = (pointer)__s;
  SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::operator=
            ((SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)
             &this->stateWhenTrue,&local_b0);
  (this->stateWhenTrue).reachable = local_18;
  if (local_b0.data_ != (pointer)__s) {
    operator_delete(local_b0.data_);
  }
  memset(__s,0,0x88);
  local_b0.len = 0;
  local_b0.cap = 2;
  local_18 = true;
  local_b0.data_ = (pointer)__s;
  SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::operator=
            ((SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)
             &this->stateWhenFalse,&local_b0);
  (this->stateWhenFalse).reachable = local_18;
  if (local_b0.data_ != (pointer)__s) {
    operator_delete(local_b0.data_);
  }
  return;
}

Assistant:

void setState(TState newState) {
        isStateSplit = false;
        state = std::move(newState);
        stateWhenTrue = {};
        stateWhenFalse = {};
    }